

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.cpp
# Opt level: O1

type unodb::qsbr_state::atomic_fetch_dec_threads_in_previous_epoch(atomic<unsigned_long> *word)

{
  ulong uVar1;
  
  LOCK();
  uVar1 = (word->super___atomic_base<unsigned_long>)._M_i;
  (word->super___atomic_base<unsigned_long>)._M_i =
       (word->super___atomic_base<unsigned_long>)._M_i - 1;
  UNLOCK();
  if (((uint)(uVar1 >> 0x20) & 0x3fffffff) < ((uint)uVar1 & 0x3fffffff)) {
    __assert_fail("threads_in_previous <= thread_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.hpp"
                  ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
  }
  if ((uVar1 & 0x3fffffff) != 0) {
    return uVar1;
  }
  __assert_fail("get_threads_in_previous_epoch(old_word) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/qsbr.cpp"
                ,0x66,
                "static qsbr_state::type unodb::qsbr_state::atomic_fetch_dec_threads_in_previous_epoch(std::atomic<qsbr_state::type> &)"
               );
}

Assistant:

[[nodiscard]] qsbr_state::type
qsbr_state::atomic_fetch_dec_threads_in_previous_epoch(
    std::atomic<qsbr_state::type> &word) noexcept {
  const auto old_word = word.fetch_sub(1, std::memory_order_acq_rel);

  UNODB_DETAIL_ASSERT(get_threads_in_previous_epoch(old_word) > 0);
  assert_invariants(old_word);

  return old_word;
}